

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coroutine.c
# Opt level: O2

int lgx_co_resume(lgx_vm_t *vm,lgx_co_t *co)

{
  lgx_co_t *plVar1;
  lgx_list_s *plVar2;
  
  if (co->status == CO_SUSPEND) {
    plVar1 = (lgx_co_t *)(co->head).next;
    if (plVar1 != co) {
      plVar2 = (co->head).prev;
      (plVar1->head).prev = plVar2;
      plVar2->next = (lgx_list_s *)plVar1;
    }
    (co->head).prev = &co->head;
    co->child = (lgx_co_s *)0x0;
    co->status = CO_READY;
    plVar2 = (vm->co_ready).prev;
    (vm->co_ready).prev = &co->head;
    (co->head).next = &vm->co_ready;
    (co->head).prev = plVar2;
    plVar2->next = &co->head;
    if (vm->co_running == (lgx_co_t *)0x0) {
      lgx_co_run(vm,co);
    }
    return 0;
  }
  __assert_fail("co->status == CO_SUSPEND",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/interpreter/coroutine.c"
                ,0xbb,"int lgx_co_resume(lgx_vm_t *, lgx_co_t *)");
}

Assistant:

int lgx_co_resume(lgx_vm_t *vm, lgx_co_t *co) {
    assert(co->status == CO_SUSPEND);

    if (!lgx_list_empty(&co->head)) {
        lgx_list_del(&co->head);
    }
    lgx_list_init(&co->head);

    co->child = NULL;
    co->status = CO_READY;

    lgx_list_add_tail(&co->head, &vm->co_ready);

    if (vm->co_running) {
        return 0;
    } else {
        return lgx_co_run(vm, co);
    }
}